

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

void __thiscall
raft_functional_common::TestSm::save_logical_snp_obj
          (TestSm *this,snapshot *s,ulong *obj_id,buffer *data,bool is_first_obj,bool is_last_obj)

{
  int32_t iVar1;
  size_t sVar2;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong log_idx;
  ptr<buffer> data_precommit;
  ptr<buffer> data_commit;
  buffer_serializer bs;
  uint64_t local_68;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  if ((this->snpDelayMs).super___atomic_base<unsigned_long>._M_i != 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    TestSuite::sleep_ms((this->snpDelayMs).super___atomic_base<unsigned_long>._M_i,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*obj_id == 0) {
    *obj_id = 1;
  }
  else {
    sVar2 = nuraft::buffer::size(data);
    if (sVar2 == 8) {
      *obj_id = *obj_id + 1;
    }
    else {
      nuraft::buffer_serializer::buffer_serializer((buffer_serializer *)&local_40,data,LITTLE);
      local_68 = nuraft::buffer_serializer::get_u64((buffer_serializer *)&local_40);
      iVar1 = nuraft::buffer_serializer::get_i32((buffer_serializer *)&local_40);
      nuraft::buffer::alloc((buffer *)&local_50,(long)iVar1);
      nuraft::buffer_serializer::get_buffer((buffer_serializer *)&local_40,(ptr<buffer> *)&local_50)
      ;
      p_Var3 = &std::
                map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                ::operator[](&this->commits,&local_68)->
                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var3,&local_50);
      nuraft::buffer::copy((EVP_PKEY_CTX *)&local_60,(EVP_PKEY_CTX *)local_50._M_ptr);
      p_Var3 = &std::
                map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                ::operator[](&this->preCommits,&local_68)->
                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var3,&local_60);
      *obj_id = *obj_id + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
  }
  return;
}

Assistant:

void save_logical_snp_obj(snapshot& s,
                              ulong& obj_id,
                              buffer& data,
                              bool is_first_obj,
                              bool is_last_obj)
    {
        if (snpDelayMs) {
            TestSuite::sleep_ms(snpDelayMs);
        }

        if (obj_id == 0) {
            // Special object containing metadata.
            // Request next object.
            obj_id++;
            return;
        }

        if (data.size() == sizeof(ulong)) {
            // Special object representing config change.
            // Nothing to do for state machine.
            // Request next object.
            obj_id++;
            return;
        }

        buffer_serializer bs(data);
        ulong log_idx = bs.get_u64();

        // In this test state machine implementation,
        // obj id should be always the same as log index.
        assert(log_idx == obj_id);

        int32 data_size = bs.get_i32();
        ptr<buffer> data_commit = buffer::alloc(data_size);
        bs.get_buffer( data_commit );

        commits[log_idx] = data_commit;

        ptr<buffer> data_precommit = buffer::copy(*data_commit);
        preCommits[log_idx] = data_precommit;

        // Request next object.
        obj_id++;
    }